

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::Server::read_content_core
          (Server *this,Stream *strm,Request *req,Response *res,ContentReceiver *receiver,
          MultipartContentHeader *multipart_header,ContentReceiver *multipart_receiver)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t payload_max_length;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  bool bVar5;
  char *pcVar6;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar7;
  string boundary;
  ContentReceiverWithProgress out;
  MultipartFormDataParser multipart_form_data_parser;
  _Any_data local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  key_type local_258;
  _Any_data local_238;
  code *local_228;
  undefined8 uStack_220;
  Server *local_218;
  Stream *local_210;
  _Any_data local_208;
  code *local_1f8;
  undefined8 uStack_1f0;
  _Any_data local_1e8;
  code *local_1d8;
  anon_class_24_3_0ed7a2d1 local_1c8;
  MultipartFormDataParser local_1b0;
  
  local_210 = strm;
  detail::MultipartFormDataParser::MultipartFormDataParser(&local_1b0);
  local_228 = (code *)0x0;
  uStack_220 = 0;
  local_238._M_unused._M_object = (void *)0x0;
  local_238._8_8_ = 0;
  bVar2 = Request::is_multipart_form_data(req);
  if (bVar2) {
    paVar1 = &local_258.field_2;
    local_258._M_dataplus._M_p = (pointer)paVar1;
    local_218 = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Content-Type","");
    pVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::equal_range(&(req->headers)._M_t,&local_258);
    if (pVar7.first._M_node._M_node == pVar7.second._M_node._M_node) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)(pVar7.first._M_node._M_node + 2);
    }
    std::__cxx11::string::string((string *)local_278._M_pod_data,pcVar6,(allocator *)&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                               local_258.field_2._M_local_buf[0]) + 1);
    }
    local_258._M_string_length = 0;
    local_258.field_2._M_local_buf[0] = '\0';
    local_258._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = detail::parse_multipart_boundary((string *)&local_278,&local_258);
    if (bVar2) {
      detail::MultipartFormDataParser::set_boundary(&local_1b0,&local_258);
      local_1c8.multipart_receiver = multipart_receiver;
      local_1c8.multipart_form_data_parser = &local_1b0;
      local_1c8.multipart_header = multipart_header;
      std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>::operator=
                ((function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)> *)
                 local_238._M_pod_data,&local_1c8);
    }
    else {
      res->status = 400;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                               local_258.field_2._M_local_buf[0]) + 1);
    }
    this = local_218;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_unused._0_8_ != &local_268) {
      operator_delete(local_278._M_unused._M_object,(ulong)(local_268._M_allocated_capacity + 1));
    }
    if (bVar2) goto LAB_0015bf5a;
  }
  else {
    std::function<bool_(const_char_*,_unsigned_long)>::function
              ((function<bool_(const_char_*,_unsigned_long)> *)&local_278,receiver);
    std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>::operator=
              ((function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)> *)
               local_238._M_pod_data,(anon_class_32_1_b7b80f6d *)&local_278);
    if ((code *)local_268._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_268._M_allocated_capacity)(&local_278,&local_278,3);
    }
LAB_0015bf5a:
    iVar3 = std::__cxx11::string::compare((char *)req);
    if (iVar3 == 0) {
      local_278._M_unused._M_object = &local_268;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Content-Length","");
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(req->headers)._M_t,(key_type *)&local_278);
      bVar2 = (_Rb_tree_header *)cVar4._M_node == &(req->headers)._M_t._M_impl.super__Rb_tree_header
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_unused._0_8_ != &local_268) {
        operator_delete(local_278._M_unused._M_object,(ulong)(local_268._M_allocated_capacity + 1));
      }
    }
    else {
      bVar2 = false;
    }
    bVar5 = true;
    if (bVar2) goto LAB_0015c095;
    payload_max_length = this->payload_max_length_;
    local_1f8 = (code *)0x0;
    uStack_1f0 = 0;
    local_208._M_unused._M_object = (void *)0x0;
    local_208._8_8_ = 0;
    std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
              ((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
               &local_1e8,
               (function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
               &local_238);
    bVar2 = detail::read_content<httplib::Request>
                      (local_210,req,payload_max_length,&res->status,(Progress *)&local_208,
                       (ContentReceiverWithProgress *)&local_1e8,true);
    if (local_1d8 != (code *)0x0) {
      (*local_1d8)(&local_1e8,&local_1e8,__destroy_functor);
    }
    if (local_1f8 != (code *)0x0) {
      (*local_1f8)(&local_208,&local_208,__destroy_functor);
    }
    if (bVar2) {
      bVar2 = Request::is_multipart_form_data(req);
      if ((!bVar2) || (local_1b0.is_valid_ != false)) goto LAB_0015c095;
      res->status = 400;
    }
  }
  bVar5 = false;
LAB_0015c095:
  if (local_228 != (code *)0x0) {
    (*local_228)(&local_238,&local_238,__destroy_functor);
  }
  detail::MultipartFormDataParser::~MultipartFormDataParser(&local_1b0);
  return bVar5;
}

Assistant:

inline bool Server::read_content_core(Stream &strm, Request &req, Response &res,
                                      ContentReceiver receiver,
                                      MultipartContentHeader multipart_header,
                                      ContentReceiver multipart_receiver) {
  detail::MultipartFormDataParser multipart_form_data_parser;
  ContentReceiverWithProgress out;

  if (req.is_multipart_form_data()) {
    const auto &content_type = req.get_header_value("Content-Type");
    std::string boundary;
    if (!detail::parse_multipart_boundary(content_type, boundary)) {
      res.status = 400;
      return false;
    }

    multipart_form_data_parser.set_boundary(std::move(boundary));
    out = [&](const char *buf, size_t n, uint64_t /*off*/, uint64_t /*len*/) {
      /* For debug
      size_t pos = 0;
      while (pos < n) {
        auto read_size = (std::min)<size_t>(1, n - pos);
        auto ret = multipart_form_data_parser.parse(
            buf + pos, read_size, multipart_receiver, multipart_header);
        if (!ret) { return false; }
        pos += read_size;
      }
      return true;
      */
      return multipart_form_data_parser.parse(buf, n, multipart_receiver,
                                              multipart_header);
    };
  } else {
    out = [receiver](const char *buf, size_t n, uint64_t /*off*/,
                     uint64_t /*len*/) { return receiver(buf, n); };
  }

  if (req.method == "DELETE" && !req.has_header("Content-Length")) {
    return true;
  }

  if (!detail::read_content(strm, req, payload_max_length_, res.status, nullptr,
                            out, true)) {
    return false;
  }

  if (req.is_multipart_form_data()) {
    if (!multipart_form_data_parser.is_valid()) {
      res.status = 400;
      return false;
    }
  }

  return true;
}